

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_scan_sse41_128_32.c
# Opt level: O0

parasail_result_t *
parasail_sw_table_scan_profile_sse41_128_32
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  int iVar1;
  parasail_matrix_t *ppVar3;
  void *pvVar4;
  __m128i *palVar5;
  longlong lVar6;
  longlong lVar7;
  longlong lVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  longlong lVar13;
  longlong lVar14;
  int iVar15;
  int iVar16;
  __m128i *b;
  __m128i *ptr;
  __m128i *b_00;
  __m128i *ptr_00;
  __m128i *ptr_01;
  undefined8 *puVar17;
  uint uVar18;
  longlong extraout_RDX;
  longlong extraout_RDX_00;
  __m128i *array;
  int32_t in_R9D;
  uint uVar19;
  int iVar20;
  uint uVar21;
  int iVar22;
  uint uVar24;
  ulong uVar23;
  __m128i a;
  __m128i c;
  __m128i c_00;
  __m128i vH_00;
  int32_t in_stack_fffffffffffff878;
  int local_77c;
  int32_t temp;
  int32_t column_len;
  int32_t *t;
  __m128i vCompare;
  __m128i vFt;
  __m128i vW;
  __m128i *pvW;
  __m128i vHp;
  __m128i vH;
  __m128i vF;
  __m128i vHt;
  __m128i vE;
  __m128i vGapper;
  parasail_result_t *result;
  __m128i vSegLenXgap;
  __m128i vNegInfFront;
  __m128i vMaxHUnit;
  __m128i vMaxH;
  __m128i vSaturationCheckMax;
  __m128i vSaturationCheckMin;
  __m128i vPosLimit;
  __m128i vNegLimit;
  int local_62c;
  int32_t score;
  __m128i vZero;
  int32_t POS_LIMIT;
  int32_t NEG_LIMIT;
  __m128i vGapE;
  __m128i vGapO;
  __m128i *pvGapper;
  __m128i *pvHMax;
  __m128i *pvH;
  __m128i *pvHt;
  __m128i *pvE;
  __m128i *pvP;
  int32_t segLen;
  int32_t segWidth;
  parasail_matrix_t *matrix;
  int32_t s1Len;
  int32_t end_ref;
  int32_t end_query;
  int32_t j;
  int32_t i;
  int gap_local;
  int open_local;
  int s2Len_local;
  char *s2_local;
  parasail_profile_t *profile_local;
  int iStack_514;
  int iStack_510;
  int local_508;
  int iStack_504;
  int iStack_500;
  int local_4e8;
  int iStack_4e4;
  int iStack_4e0;
  int local_4d8;
  int iStack_4d4;
  int iStack_4d0;
  int local_4c8;
  int iStack_4c4;
  int iStack_4c0;
  int iStack_4bc;
  int local_4b8;
  int iStack_4b4;
  int iStack_4b0;
  int iStack_4ac;
  int local_478;
  int iStack_474;
  int iStack_470;
  int iStack_46c;
  int local_458;
  int iStack_454;
  int iStack_450;
  int iStack_44c;
  int local_438;
  int iStack_434;
  int iStack_430;
  int iStack_42c;
  int local_418;
  int iStack_414;
  int iStack_410;
  int iStack_40c;
  int local_328;
  int iStack_324;
  int iStack_320;
  int iStack_31c;
  int local_2f8;
  int iStack_2f4;
  int iStack_2f0;
  int iStack_2ec;
  int local_2b8;
  int iStack_2b4;
  int iStack_2b0;
  int iStack_2ac;
  int local_1d8;
  int iStack_1d4;
  int iStack_1d0;
  int local_198;
  int iStack_194;
  int iStack_190;
  int iStack_18c;
  int local_178;
  int iStack_174;
  int iStack_170;
  int iStack_16c;
  int local_168;
  int iStack_164;
  int iStack_160;
  int iStack_15c;
  int local_e8;
  int iStack_e4;
  int iStack_e0;
  int iStack_dc;
  int iVar2;
  size_t len;
  
  if (profile == (parasail_profile_t *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sw_table_scan_profile_sse41_128_32","profile");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if ((profile->profile32).score == (void *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sw_table_scan_profile_sse41_128_32",
            "profile->profile32.score");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (profile->matrix == (parasail_matrix_t *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sw_table_scan_profile_sse41_128_32",
            "profile->matrix");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (profile->s1Len < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_sw_table_scan_profile_sse41_128_32",
            "profile->s1Len");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (s2 == (char *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sw_table_scan_profile_sse41_128_32","s2");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (s2Len < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_sw_table_scan_profile_sse41_128_32","s2Len");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (open < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_sw_table_scan_profile_sse41_128_32","open");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (gap < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_sw_table_scan_profile_sse41_128_32","gap");
    profile_local = (parasail_profile_t *)0x0;
  }
  else {
    matrix._4_4_ = 0;
    s1Len = profile->s1Len;
    ppVar3 = profile->matrix;
    iVar15 = (s1Len + 3) / 4;
    pvVar4 = (profile->profile32).score;
    if (-open < ppVar3->min) {
      local_77c = open + -0x80000000;
    }
    else {
      local_77c = -0x80000000 - ppVar3->min;
    }
    local_77c = local_77c + 1;
    iVar16 = 0x7ffffffe - ppVar3->max;
    lVar13 = CONCAT44(local_77c,local_77c);
    lVar14 = CONCAT44(local_77c,local_77c);
    vSaturationCheckMax[1] = CONCAT44(iVar16,iVar16);
    vSaturationCheckMin[0] = CONCAT44(iVar16,iVar16);
    profile_local = (parasail_profile_t *)parasail_result_new_table1(iVar15 * 4,s2Len);
    if (profile_local == (parasail_profile_t *)0x0) {
      profile_local = (parasail_profile_t *)0x0;
    }
    else {
      *(uint *)&profile_local->field_0xc = *(uint *)&profile_local->field_0xc | 0x4400404;
      uVar18 = *(uint *)&profile_local->field_0xc | 0x20000;
      len = (size_t)uVar18;
      *(uint *)&profile_local->field_0xc = uVar18;
      b = parasail_memalign___m128i(0x10,(long)iVar15);
      ptr = parasail_memalign___m128i(0x10,(long)iVar15);
      b_00 = parasail_memalign___m128i(0x10,(long)iVar15);
      ptr_00 = parasail_memalign___m128i(0x10,(long)iVar15);
      ptr_01 = parasail_memalign___m128i(0x10,(long)iVar15);
      if (b == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (b_00 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr_00 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr_01 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else {
        c[0] = (long)iVar15;
        c[1] = extraout_RDX;
        parasail_memset___m128i(b_00,c,len);
        c_00[0] = (long)iVar15;
        c_00[1] = extraout_RDX_00;
        array = b;
        parasail_memset___m128i(b,c_00,len);
        vE[1]._0_4_ = -open;
        vE[1]._4_4_ = -open;
        vGapper[0]._0_4_ = -open;
        vGapper[0]._4_4_ = -open;
        end_query = iVar15;
        while (end_query = end_query + -1, -1 < end_query) {
          ptr_01[end_query][0] = CONCAT44(vE[1]._4_4_,(int)vE[1]);
          ptr_01[end_query][1] = CONCAT44(vGapper[0]._4_4_,(int)vGapper[0]);
          vE[1]._0_4_ = (int)vE[1] - gap;
          vE[1]._4_4_ = vE[1]._4_4_ - gap;
          vGapper[0]._0_4_ = (int)vGapper[0] - gap;
          vGapper[0]._4_4_ = vGapper[0]._4_4_ - gap;
        }
        vNegInfFront[1] = lVar13;
        vMaxHUnit[0] = lVar14;
        vMaxHUnit[1] = lVar13;
        vMaxH[0] = lVar14;
        vMaxH[1] = lVar13;
        vSaturationCheckMax[0] = lVar14;
        local_62c = local_77c;
        for (end_ref = 0; end_ref < s2Len; end_ref = end_ref + 1) {
          uVar23 = b_00[iVar15 + -1][0];
          vH_00[0] = (ulong)end_ref;
          iVar20 = ppVar3->mapper[(byte)s2[vH_00[0]]];
          vF[1] = 0;
          vHt[0] = 0;
          end_query = 0;
          pvW = (__m128i *)(uVar23 << 0x20);
          vHp[0] = b_00[iVar15 + -1][1] << 0x20 | uVar23 >> 0x20;
          vH[1] = lVar13;
          vF[0] = lVar14;
          while( true ) {
            local_4d8 = (int)vF[1];
            local_1d8 = (int)vH[1];
            iStack_1d4 = (int)((ulong)vH[1] >> 0x20);
            iStack_1d0 = (int)vF[0];
            iStack_4d4 = (int)((ulong)vF[1] >> 0x20);
            iStack_4d0 = (int)vHt[0];
            if (iVar15 <= end_query) break;
            palVar5 = (__m128i *)b_00[end_query][0];
            lVar6 = b_00[end_query][1];
            lVar7 = b[end_query][0];
            lVar8 = b[end_query][1];
            puVar17 = (undefined8 *)
                      ((long)pvVar4 + (long)end_query * 0x10 + (long)(iVar20 * iVar15) * 0x10);
            uVar9 = *puVar17;
            uVar10 = puVar17[1];
            local_418 = (int)lVar7;
            iStack_414 = (int)((ulong)lVar7 >> 0x20);
            iStack_410 = (int)lVar8;
            iStack_40c = (int)((ulong)lVar8 >> 0x20);
            local_418 = local_418 - gap;
            iStack_414 = iStack_414 - gap;
            iStack_410 = iStack_410 - gap;
            iStack_40c = iStack_40c - gap;
            local_438 = (int)palVar5;
            iStack_434 = (int)((ulong)palVar5 >> 0x20);
            iStack_430 = (int)lVar6;
            iStack_42c = (int)((ulong)lVar6 >> 0x20);
            local_438 = local_438 - open;
            iStack_434 = iStack_434 - open;
            iStack_430 = iStack_430 - open;
            iStack_42c = iStack_42c - open;
            uVar18 = (uint)(local_418 < local_438) * local_438 |
                     (uint)(local_418 >= local_438) * local_418;
            uVar19 = (uint)(iStack_414 < iStack_434) * iStack_434 |
                     (uint)(iStack_414 >= iStack_434) * iStack_414;
            uVar21 = (uint)(iStack_410 < iStack_430) * iStack_430 |
                     (uint)(iStack_410 >= iStack_430) * iStack_410;
            uVar24 = (uint)(iStack_40c < iStack_42c) * iStack_42c |
                     (uint)(iStack_40c >= iStack_42c) * iStack_40c;
            vHt[1] = CONCAT44(uVar19,uVar18);
            vE[0] = CONCAT44(uVar24,uVar21);
            local_4b8 = (int)pvW;
            iStack_4b4 = (int)((ulong)pvW >> 0x20);
            iStack_4b0 = (int)vHp[0];
            iStack_4ac = (int)((ulong)vHp[0] >> 0x20);
            local_4c8 = (int)uVar9;
            iStack_4c4 = (int)((ulong)uVar9 >> 0x20);
            iStack_4c0 = (int)uVar10;
            iStack_4bc = (int)((ulong)uVar10 >> 0x20);
            local_4b8 = local_4b8 + local_4c8;
            iStack_4b4 = iStack_4b4 + iStack_4c4;
            iStack_4b0 = iStack_4b0 + iStack_4c0;
            iStack_4ac = iStack_4ac + iStack_4bc;
            lVar7 = ptr_01[end_query][0];
            local_4e8 = (int)lVar7;
            iStack_4e4 = (int)((ulong)lVar7 >> 0x20);
            iStack_4e0 = (int)ptr_01[end_query][1];
            local_4d8 = local_4d8 + local_4e8;
            iStack_4d4 = iStack_4d4 + iStack_4e4;
            iStack_4d0 = iStack_4d0 + iStack_4e0;
            vH[1] = CONCAT44((uint)(iStack_1d4 < iStack_4d4) * iStack_4d4 |
                             (uint)(iStack_1d4 >= iStack_4d4) * iStack_1d4,
                             (uint)(local_1d8 < local_4d8) * local_4d8 |
                             (uint)(local_1d8 >= local_4d8) * local_1d8);
            vF[0] = (longlong)
                    ((uint)(iStack_1d0 < iStack_4d0) * iStack_4d0 |
                    (uint)(iStack_1d0 >= iStack_4d0) * iStack_1d0);
            vF[1] = CONCAT44((uint)((int)uVar19 < iStack_4b4) * iStack_4b4 |
                             ((int)uVar19 >= iStack_4b4) * uVar19,
                             (uint)((int)uVar18 < local_4b8) * local_4b8 |
                             ((int)uVar18 >= local_4b8) * uVar18);
            vHt[0] = CONCAT44((uint)((int)uVar24 < iStack_4ac) * iStack_4ac |
                              ((int)uVar24 >= iStack_4ac) * uVar24,
                              (uint)((int)uVar21 < iStack_4b0) * iStack_4b0 |
                              ((int)uVar21 >= iStack_4b0) * uVar21);
            b[end_query][0] = vHt[1];
            b[end_query][1] = vE[0];
            ptr[end_query][0] = vF[1];
            ptr[end_query][1] = vHt[0];
            end_query = end_query + 1;
            pvW = palVar5;
            vHp[0] = lVar6;
          }
          local_508 = (int)(*ptr_01)[0];
          iStack_504 = (int)((ulong)(*ptr_01)[0] >> 0x20);
          iStack_500 = (int)(*ptr_01)[1];
          iStack_504 = local_4d8 + iStack_504;
          iStack_500 = iStack_4d4 + iStack_500;
          uVar18 = (uint)(iStack_1d0 < iStack_500) * iStack_500 |
                   (uint)(iStack_1d0 >= iStack_500) * iStack_1d0;
          vH[1] = CONCAT44((uint)(iStack_1d4 < iStack_504) * iStack_504 |
                           (uint)(iStack_1d4 >= iStack_504) * iStack_1d4,
                           (uint)(local_1d8 < local_508) * local_508 |
                           (uint)(local_1d8 >= local_508) * local_1d8);
          end_query = 0;
          while( true ) {
            vF[0] = (longlong)uVar18;
            iStack_514 = (int)vH[1];
            iStack_510 = (int)((ulong)vH[1] >> 0x20);
            if (1 < end_query) break;
            iVar20 = iStack_514 + -iVar15 * gap;
            iVar22 = iStack_510 + -iVar15 * gap;
            uVar18 = (uint)((int)uVar18 < iVar22) * iVar22 | ((int)uVar18 >= iVar22) * uVar18;
            vH[1] = CONCAT44((uint)(iStack_510 < iVar20) * iVar20 |
                             (uint)(iStack_510 >= iVar20) * iStack_510,
                             (uint)(iStack_514 < local_77c) * local_77c |
                             (uint)(iStack_514 >= local_77c) * iStack_514);
            end_query = end_query + 1;
          }
          vF[0] = vF[0] << 0x20 | (ulong)vH[1] >> 0x20;
          vH[1] = CONCAT44(iStack_514,local_77c);
          iVar20 = (uint)(0 < local_77c) * local_77c;
          uVar19 = (uint)(local_4d8 < iStack_514) * iStack_514 |
                   (uint)(local_4d8 >= iStack_514) * local_4d8;
          uVar21 = (uint)(iStack_4d4 < iStack_510) * iStack_510 |
                   (uint)(iStack_4d4 >= iStack_510) * iStack_4d4;
          uVar18 = (iStack_4d0 < (int)uVar18) * uVar18 |
                   (uint)(iStack_4d0 >= (int)uVar18) * iStack_4d0;
          vHp[1] = CONCAT44((-1 < (int)uVar19) * uVar19,(uint)(-1 < iVar20) * iVar20);
          vH[0] = CONCAT44((-1 < (int)uVar18) * uVar18,(-1 < (int)uVar21) * uVar21);
          end_query = 0;
          while( true ) {
            local_328 = (int)vMaxHUnit[1];
            iStack_324 = (int)((ulong)vMaxHUnit[1] >> 0x20);
            iStack_320 = (int)vMaxH[0];
            iStack_31c = (int)((ulong)vMaxH[0] >> 0x20);
            if (iVar15 <= end_query) break;
            lVar6 = ptr[end_query][0];
            lVar7 = ptr[end_query][1];
            local_458 = (int)vH[1];
            iStack_454 = (int)((ulong)vH[1] >> 0x20);
            iStack_450 = (int)vF[0];
            iStack_44c = (int)((ulong)vF[0] >> 0x20);
            local_458 = local_458 - gap;
            iStack_454 = iStack_454 - gap;
            iStack_450 = iStack_450 - gap;
            iStack_44c = iStack_44c - gap;
            local_478 = (int)vHp[1];
            iStack_474 = (int)((ulong)vHp[1] >> 0x20);
            iStack_470 = (int)vH[0];
            iStack_46c = (int)((ulong)vH[0] >> 0x20);
            local_478 = local_478 - open;
            iStack_474 = iStack_474 - open;
            iStack_470 = iStack_470 - open;
            iStack_46c = iStack_46c - open;
            uVar18 = (uint)(local_458 < local_478) * local_478 |
                     (uint)(local_458 >= local_478) * local_458;
            uVar19 = (uint)(iStack_454 < iStack_474) * iStack_474 |
                     (uint)(iStack_454 >= iStack_474) * iStack_454;
            uVar21 = (uint)(iStack_450 < iStack_470) * iStack_470 |
                     (uint)(iStack_450 >= iStack_470) * iStack_450;
            uVar24 = (uint)(iStack_44c < iStack_46c) * iStack_46c |
                     (uint)(iStack_44c >= iStack_46c) * iStack_44c;
            vH[1] = CONCAT44(uVar19,uVar18);
            vF[0] = CONCAT44(uVar24,uVar21);
            local_2b8 = (int)lVar6;
            iStack_2b4 = (int)((ulong)lVar6 >> 0x20);
            iStack_2b0 = (int)lVar7;
            iStack_2ac = (int)((ulong)lVar7 >> 0x20);
            uVar18 = (local_2b8 < (int)uVar18) * uVar18 |
                     (uint)(local_2b8 >= (int)uVar18) * local_2b8;
            uVar19 = (iStack_2b4 < (int)uVar19) * uVar19 |
                     (uint)(iStack_2b4 >= (int)uVar19) * iStack_2b4;
            uVar21 = (iStack_2b0 < (int)uVar21) * uVar21 |
                     (uint)(iStack_2b0 >= (int)uVar21) * iStack_2b0;
            uVar24 = (iStack_2ac < (int)uVar24) * uVar24 |
                     (uint)(iStack_2ac >= (int)uVar24) * iStack_2ac;
            iVar20 = (-1 < (int)uVar18) * uVar18;
            iVar22 = (-1 < (int)uVar19) * uVar19;
            iVar1 = (-1 < (int)uVar21) * uVar21;
            iVar2 = (-1 < (int)uVar24) * uVar24;
            vHp[1] = CONCAT44(iVar22,iVar20);
            vH[0] = CONCAT44(iVar2,iVar1);
            b_00[end_query][0] = vHp[1];
            b_00[end_query][1] = vH[0];
            local_198 = (int)vSaturationCheckMax[1];
            iStack_194 = (int)((ulong)vSaturationCheckMax[1] >> 0x20);
            iStack_190 = (int)vSaturationCheckMin[0];
            iStack_18c = (int)((ulong)vSaturationCheckMin[0] >> 0x20);
            vSaturationCheckMax[1] =
                 CONCAT44((uint)(iVar22 < iStack_194) * iVar22 |
                          (uint)(iVar22 >= iStack_194) * iStack_194,
                          (uint)(iVar20 < local_198) * iVar20 |
                          (uint)(iVar20 >= local_198) * local_198);
            vSaturationCheckMin[0] =
                 CONCAT44((uint)(iVar2 < iStack_18c) * iVar2 |
                          (uint)(iVar2 >= iStack_18c) * iStack_18c,
                          (uint)(iVar1 < iStack_190) * iVar1 |
                          (uint)(iVar1 >= iStack_190) * iStack_190);
            local_2f8 = (int)vMaxH[1];
            iStack_2f4 = (int)((ulong)vMaxH[1] >> 0x20);
            iStack_2f0 = (int)vSaturationCheckMax[0];
            iStack_2ec = (int)((ulong)vSaturationCheckMax[0] >> 0x20);
            vMaxH[1] = CONCAT44((uint)(iStack_2f4 < iVar22) * iVar22 |
                                (uint)(iStack_2f4 >= iVar22) * iStack_2f4,
                                (uint)(local_2f8 < iVar20) * iVar20 |
                                (uint)(local_2f8 >= iVar20) * local_2f8);
            vSaturationCheckMax[0] =
                 CONCAT44((uint)(iStack_2ec < iVar2) * iVar2 |
                          (uint)(iStack_2ec >= iVar2) * iStack_2ec,
                          (uint)(iStack_2f0 < iVar1) * iVar1 |
                          (uint)(iStack_2f0 >= iVar1) * iStack_2f0);
            array = (__m128i *)
                    ((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&profile_local->matrix)->
                    rowcols->score_row;
            vH_00[0] = (ulong)(uint)end_query;
            vH_00[1]._0_4_ = iVar15;
            vH_00[1]._4_4_ = 0;
            arr_store_si128((int *)array,vH_00,end_ref,s2Len,in_R9D,in_stack_fffffffffffff878);
            vMaxHUnit[1] = CONCAT44((uint)(iVar22 < iStack_324) * iStack_324 |
                                    (uint)(iVar22 >= iStack_324) * iVar22,
                                    (uint)(iVar20 < local_328) * local_328 |
                                    (uint)(iVar20 >= local_328) * iVar20);
            vMaxH[0] = CONCAT44((uint)(iVar2 < iStack_31c) * iStack_31c |
                                (uint)(iVar2 >= iStack_31c) * iVar2,
                                (uint)(iVar1 < iStack_320) * iStack_320 |
                                (uint)(iVar1 >= iStack_320) * iVar1);
            end_query = end_query + 1;
          }
          local_168 = (int)vNegInfFront[1];
          iStack_164 = (int)((ulong)vNegInfFront[1] >> 0x20);
          iStack_160 = (int)vMaxHUnit[0];
          iStack_15c = (int)((ulong)vMaxHUnit[0] >> 0x20);
          uVar18 = -(uint)(iStack_160 < iStack_320);
          uVar19 = -(uint)(iStack_15c < iStack_31c);
          auVar12._4_4_ = -(uint)(iStack_164 < iStack_324);
          auVar12._0_4_ = -(uint)(local_168 < local_328);
          auVar12._12_4_ = uVar19;
          auVar12._8_4_ = uVar18;
          if ((((((((((((((((auVar12 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                           (auVar12 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar12 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar12 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar12 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar12 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar12 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar12 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (uVar18 & 0x80) != 0) || (uVar18 & 0x8000) != 0) || (uVar18 & 0x800000) != 0) ||
                 uVar18 != 0) || (uVar19 >> 7 & 1) != 0) || (uVar19 >> 0xf & 1) != 0) ||
              (uVar19 >> 0x17 & 1) != 0) || iStack_15c < iStack_31c) {
            a[1] = vH_00[0];
            a[0] = (longlong)array;
            local_62c = _mm_hmax_epi32_rpl(a);
            vNegInfFront[1] = CONCAT44(local_62c,local_62c);
            vMaxHUnit[0] = CONCAT44(local_62c,local_62c);
            matrix._4_4_ = end_ref;
            array = ptr_00;
            memcpy(ptr_00,b_00,(long)iVar15 << 4);
          }
        }
        _temp = ptr_00;
        for (end_query = 0; end_query < iVar15 * 4; end_query = end_query + 1) {
          if (((int)(*_temp)[0] == local_62c) &&
             (iVar20 = end_query / 4 + (end_query % 4) * iVar15, iVar20 < s1Len)) {
            s1Len = iVar20;
          }
          _temp = (__m128i *)((long)*_temp + 4);
        }
        local_e8 = (int)vSaturationCheckMax[1];
        iStack_e4 = (int)((ulong)vSaturationCheckMax[1] >> 0x20);
        iStack_e0 = (int)vSaturationCheckMin[0];
        iStack_dc = (int)((ulong)vSaturationCheckMin[0] >> 0x20);
        local_178 = (int)vMaxH[1];
        iStack_174 = (int)((ulong)vMaxH[1] >> 0x20);
        iStack_170 = (int)vSaturationCheckMax[0];
        iStack_16c = (int)((ulong)vSaturationCheckMax[0] >> 0x20);
        uVar23 = CONCAT44(-(uint)(iStack_dc < local_77c),-(uint)(iStack_e0 < local_77c)) |
                 CONCAT44(-(uint)(iVar16 < iStack_16c),-(uint)(iVar16 < iStack_170));
        auVar11._8_8_ = uVar23;
        auVar11._0_8_ =
             CONCAT44(-(uint)(iStack_e4 < local_77c),-(uint)(local_e8 < local_77c)) |
             CONCAT44(-(uint)(iVar16 < iStack_174),-(uint)(iVar16 < local_178));
        if ((((((((((((((((auVar11 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                         (auVar11 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar11 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar11 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar11 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar11 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar11 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar11 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (uVar23 >> 7 & 1) != 0) || (uVar23 >> 0xf & 1) != 0) || (uVar23 >> 0x17 & 1) != 0)
               || (uVar23 >> 0x1f & 1) != 0) || (uVar23 >> 0x27 & 1) != 0) ||
             (uVar23 >> 0x2f & 1) != 0) || (uVar23 >> 0x37 & 1) != 0) || (long)uVar23 < 0) {
          *(uint *)&profile_local->field_0xc = *(uint *)&profile_local->field_0xc | 0x40;
          local_62c = 0;
          s1Len = 0;
          matrix._4_4_ = 0;
        }
        *(int *)&profile_local->s1 = local_62c;
        *(int32_t *)((long)&profile_local->s1 + 4) = s1Len;
        profile_local->s1Len = matrix._4_4_;
        parasail_free(ptr_01);
        parasail_free(ptr_00);
        parasail_free(b_00);
        parasail_free(ptr);
        parasail_free(b);
      }
    }
  }
  return (parasail_result_t *)profile_local;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t s1Len = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
#ifdef PARASAIL_ROWCOL
    int32_t offset = 0;
    int32_t position = 0;
#endif
    __m128i* restrict pvP = NULL;
    __m128i* restrict pvE = NULL;
    __m128i* restrict pvHt = NULL;
    __m128i* restrict pvH = NULL;
    __m128i* restrict pvHMax = NULL;
    __m128i* restrict pvGapper = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int32_t NEG_LIMIT = 0;
    int32_t POS_LIMIT = 0;
    __m128i vZero;
    int32_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vMaxH;
    __m128i vMaxHUnit;
    __m128i vNegInfFront;
    __m128i vSegLenXgap;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile32.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    end_query = 0;
    end_ref = 0;
    s1Len = profile->s1Len;
    matrix = profile->matrix;
    segWidth = 4; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
#ifdef PARASAIL_ROWCOL
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
#endif
    pvP = (__m128i*)profile->profile32.score;
    vGapO = _mm_set1_epi32(open);
    vGapE = _mm_set1_epi32(gap);
    NEG_LIMIT = (-open < matrix->min ? INT32_MIN + open : INT32_MIN - matrix->min) + 1;
    POS_LIMIT = INT32_MAX - matrix->max - 1;
    vZero = _mm_setzero_si128();
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi32(NEG_LIMIT);
    vPosLimit = _mm_set1_epi32(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vMaxHUnit = vNegLimit;
    vNegInfFront = vZero;
    vNegInfFront = _mm_insert_epi32(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm_add_epi32(vNegInfFront,
            _mm_slli_si128(_mm_set1_epi32(-segLen*gap), 4));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_BITS_32 | PARASAIL_FLAG_LANES_4;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE = parasail_memalign___m128i(16, segLen);
    pvHt= parasail_memalign___m128i(16, segLen);
    pvH = parasail_memalign___m128i(16, segLen);
    pvHMax = parasail_memalign___m128i(16, segLen);
    pvGapper = parasail_memalign___m128i(16, segLen);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!pvHt) return NULL;
    if (!pvH) return NULL;
    if (!pvHMax) return NULL;
    if (!pvGapper) return NULL;

    parasail_memset___m128i(pvH, vZero, segLen);
    parasail_memset___m128i(pvE, vNegLimit, segLen);
    {
        __m128i vGapper = _mm_sub_epi32(vZero,vGapO);
        for (i=segLen-1; i>=0; --i) {
            _mm_store_si128(pvGapper+i, vGapper);
            vGapper = _mm_sub_epi32(vGapper, vGapE);
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        __m128i vHt;
        __m128i vF;
        __m128i vH;
        __m128i vHp;
        __m128i *pvW;
        __m128i vW;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm_load_si128(pvH+(segLen-1));
        vHp = _mm_slli_si128(vHp, 4);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = vZero;
        vF = vNegLimit;
        for (i=0; i<segLen; ++i) {
            vH = _mm_load_si128(pvH+i);
            vE = _mm_load_si128(pvE+i);
            vW = _mm_load_si128(pvW+i);
            vE = _mm_max_epi32(
                    _mm_sub_epi32(vE, vGapE),
                    _mm_sub_epi32(vH, vGapO));
            vHp = _mm_add_epi32(vHp, vW);
            vF = _mm_max_epi32(vF, _mm_add_epi32(vHt, pvGapper[i]));
            vHt = _mm_max_epi32(vE, vHp);
            _mm_store_si128(pvE+i, vE);
            _mm_store_si128(pvHt+i, vHt);
            vHp = vH;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm_slli_si128(vHt, 4);
        vF = _mm_max_epi32(vF, _mm_add_epi32(vHt, pvGapper[0]));
        for (i=0; i<segWidth-2; ++i) {
            __m128i vFt = _mm_slli_si128(vF, 4);
            vFt = _mm_add_epi32(vFt, vSegLenXgap);
            vF = _mm_max_epi32(vF, vFt);
        }

        /* calculate final H */
        vF = _mm_slli_si128(vF, 4);
        vF = _mm_add_epi32(vF, vNegInfFront);
        vH = _mm_max_epi32(vHt, vF);
        vH = _mm_max_epi32(vH, vZero);
        for (i=0; i<segLen; ++i) {
            vHt = _mm_load_si128(pvHt+i);
            vF = _mm_max_epi32(
                    _mm_sub_epi32(vF, vGapE),
                    _mm_sub_epi32(vH, vGapO));
            vH = _mm_max_epi32(vHt, vF);
            vH = _mm_max_epi32(vH, vZero);
            _mm_store_si128(pvH+i, vH);
            vSaturationCheckMin = _mm_min_epi32(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
            vMaxH = _mm_max_epi32(vH, vMaxH);
        } 

        {
            __m128i vCompare = _mm_cmpgt_epi32(vMaxH, vMaxHUnit);
            if (_mm_movemask_epi8(vCompare)) {
                score = _mm_hmax_epi32_rpl(vMaxH);
                vMaxHUnit = _mm_set1_epi32(score);
                end_ref = j;
                (void)memcpy(pvHMax, pvH, sizeof(__m128i)*segLen);
            }
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            int32_t k = 0;
            __m128i vH = _mm_load_si128(pvH + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 4);
            }
            result->rowcols->score_row[j] = (int32_t) _mm_extract_epi32 (vH, 3);
        }
#endif
    }

    /* Trace the alignment ending position on read. */
    {
        int32_t *t = (int32_t*)pvHMax;
        int32_t column_len = segLen * segWidth;
        end_query = s1Len;
        for (i = 0; i<column_len; ++i, ++t) {
            if (*t == score) {
                int32_t temp = i / segWidth + i % segWidth * segLen;
                if (temp < end_query) {
                    end_query = temp;
                }
            }
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvH+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi32(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi32(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvGapper);
    parasail_free(pvHMax);
    parasail_free(pvH);
    parasail_free(pvHt);
    parasail_free(pvE);

    return result;
}